

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O0

void * enter(hash_table_t *h,uint32 hash,char *key,size_t len,void *val,int32 replace)

{
  hash_entry_t *phVar1;
  hash_entry_s *phVar2;
  void *oldval;
  hash_entry_t *new;
  hash_entry_t *cur;
  int32 replace_local;
  void *val_local;
  size_t len_local;
  char *key_local;
  uint32 hash_local;
  hash_table_t *h_local;
  
  phVar1 = lookup(h,hash,key,len);
  if (phVar1 == (hash_entry_t *)0x0) {
    phVar1 = h->table + hash;
    if (phVar1->key == (char *)0x0) {
      phVar1->key = key;
      phVar1->len = len;
      phVar1->val = val;
      phVar1->next = (hash_entry_s *)0x0;
    }
    else {
      phVar2 = (hash_entry_s *)
               __ckd_calloc__(1,0x20,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/hash_table.c"
                              ,0x194);
      phVar2->key = key;
      phVar2->len = len;
      phVar2->val = val;
      phVar2->next = phVar1->next;
      phVar1->next = phVar2;
    }
    h->inuse = h->inuse + 1;
    h_local = (hash_table_t *)val;
  }
  else {
    h_local = (hash_table_t *)phVar1->val;
    if (replace != 0) {
      phVar1->key = key;
      phVar1->val = val;
    }
  }
  return h_local;
}

Assistant:

static void *
enter(hash_table_t * h, uint32 hash, const char *key, size_t len, void *val, int32 replace)
{
    hash_entry_t *cur, *new;

    if ((cur = lookup(h, hash, key, len)) != NULL) {
        void *oldval;
        /* Key already exists. */
        oldval = cur->val;
        if (replace) {
            /* Replace the pointer if replacement is requested,
             * because this might be a different instance of the same
             * string (this verges on magic, sorry) */
            cur->key = key;
            cur->val = val;
        }
        return oldval;
    }

    cur = &(h->table[hash]);
    if (cur->key == NULL) {
        /* Empty slot at hashed location; add this entry */
        cur->key = key;
        cur->len = len;
        cur->val = val;

        /* Added by ARCHAN at 20050515. This allows deletion could work. */
        cur->next = NULL;

    }
    else {
        /* Key collision; create new entry and link to hashed location */
        new = (hash_entry_t *) ckd_calloc(1, sizeof(hash_entry_t));
        new->key = key;
        new->len = len;
        new->val = val;
        new->next = cur->next;
        cur->next = new;
    }
    ++h->inuse;

    return val;
}